

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

double __thiscall VCClusterQuad::energyWithoutItem(VCClusterQuad *this,VCFace *f)

{
  size_type sVar1;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar2;
  long in_RSI;
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_RDI;
  ReturnType RVar3;
  ReturnType RVar4;
  Vector3d zi;
  double a;
  Vector3d ws;
  Matrix4d Eo;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffed0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  *in_stack_fffffffffffffed8;
  VCClusterQuad *in_stack_fffffffffffffee8;
  double local_8;
  
  sVar1 = std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::size
                    ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27f07d);
  if (sVar1 < 2) {
    local_8 = 0.0;
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffee8,in_RDI
              );
    Eigen::Matrix<double,4,4,0,4,4>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,4,4,0,4,4>const,Eigen::Matrix<double,4,4,0,4,4>const>>
              ((Matrix<double,_4,_4,_0,_4,_4> *)in_RDI,in_stack_fffffffffffffed8);
    pMVar2 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(in_RDI + 0x40);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*
              (pMVar2,(Scalar *)in_stack_fffffffffffffed0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffee8,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_RDI);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)pMVar2);
    pMVar2 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (*(double *)
               ((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_RDI + 0x58) - *(double *)(in_RSI + 0x120));
    center(in_stack_fffffffffffffee8,(Matrix4d *)in_RDI);
    if (((double)pMVar2 != 0.0) || (NAN((double)pMVar2))) {
      RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              dot<Eigen::Matrix<double,3,1,0,3,1>>(in_stack_fffffffffffffed0,pMVar2);
      RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              dot<Eigen::Matrix<double,3,1,0,3,1>>(in_stack_fffffffffffffed0,pMVar2);
      local_8 = (double)pMVar2 * RVar3 + -(RVar4 * 2.0);
    }
    else {
      local_8 = 0.0;
    }
  }
  return local_8;
}

Assistant:

double VCClusterQuad::energyWithoutItem(VCFace* f) {
	if (items.size() <= 1)
		return ENG_NULL;
	Matrix4d Eo = E - f->E;
	Vector3d ws = weightedSum - f->center * f->area;
	double a = area - f->area;
	Vector3d zi = center(Eo);
	return a == 0 ? ENG_NULL : a * zi.dot(zi) - 2 * zi.dot(ws);
}